

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O1

defyx_cache * defyx_alloc_cache(defyx_flags flags)

{
  char *pcVar1;
  code *pcVar2;
  defyx_cache *pdVar3;
  JitCompilerX86 *pJVar4;
  uint8_t *puVar5;
  undefined *puVar6;
  char cVar7;
  ulong uVar8;
  int extraout_EDX;
  undefined1 *puVar9;
  undefined1 *puVar10;
  long unaff_RBP;
  code *UNRECOVERED_JUMPTABLE;
  defyx_cache *unaff_R12;
  defyx_flags dVar11;
  
  puVar10 = &stack0xffffffffffffffd8;
  puVar9 = &stack0xffffffffffffffd8;
  pdVar3 = (defyx_cache *)operator_new(0x2130);
  memset(pdVar3,0,0x2130);
  (pdVar3->cacheKey)._M_dataplus._M_p = (pointer)&(pdVar3->cacheKey).field_2;
  (pdVar3->cacheKey)._M_string_length = 0;
  (pdVar3->cacheKey).field_2._M_local_buf[0] = '\0';
  dVar11 = flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES);
  uVar8 = (ulong)(int)(&switchD_0011c339::switchdataD_0012f740)[dVar11];
  cVar7 = (char)(&switchD_0011c339::switchdataD_0012f740)[dVar11] + '@';
  switch(dVar11) {
  case RANDOMX_FLAG_DEFAULT:
    pdVar3->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    pdVar3->jit = (JitCompiler *)0x0;
    pdVar3->initialize = defyx::initCache;
    pdVar3->datasetInit = defyx::initDataset;
    puVar5 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(0x8000000);
    goto LAB_0011c443;
  case RANDOMX_FLAG_LARGE_PAGES:
    pdVar3->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    pdVar3->jit = (JitCompiler *)0x0;
    pdVar3->initialize = defyx::initCache;
    pdVar3->datasetInit = defyx::initDataset;
    puVar5 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x8000000);
    goto LAB_0011c443;
  default:
    operator_delete(unaff_R12);
    if (extraout_EDX == 1) {
      __cxa_begin_catch(&switchD_0011c339::switchdataD_0012f740);
      if (pdVar3 != (defyx_cache *)0x0) {
        defyx_release_cache(pdVar3);
      }
      __cxa_end_catch();
      return (defyx_cache *)0x0;
    }
    _Unwind_Resume(&switchD_0011c339::switchdataD_0012f740);
  case RANDOMX_FLAG_JIT:
    pdVar3->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    pJVar4 = (JitCompilerX86 *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(pJVar4);
    pdVar3->jit = pJVar4;
    pdVar3->initialize = defyx::initCacheCompile;
    pdVar3->datasetInit = (DatasetInitFunc *)pJVar4->code;
    puVar5 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(0x8000000);
    goto LAB_0011c443;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    pdVar3->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    pJVar4 = (JitCompilerX86 *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(pJVar4);
    pdVar3->jit = pJVar4;
    pdVar3->initialize = defyx::initCacheCompile;
    pdVar3->datasetInit = (DatasetInitFunc *)pJVar4->code;
    puVar5 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x8000000);
LAB_0011c443:
    pdVar3->memory = puVar5;
    return pdVar3;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    pdVar3 = (defyx_cache *)(*UNRECOVERED_JUMPTABLE)();
    return pdVar3;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    pcVar1 = (char *)((long)lutDec3 + uVar8 + 0x389);
    *pcVar1 = *pcVar1 + cVar7;
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar7;
    puVar9 = (undefined1 *)0x41024;
    pcVar1 = (char *)((long)lutDec3 + uVar8 + 0x3c6);
    *pcVar1 = *pcVar1 + '@';
    switchD_0011c339::switchdataD_0012f740._0_1_ = 0x3b;
    puVar6 = &defyx::InterpretedVm<defyx::LargePageAllocator,false>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    unaff_R12->memory = (uint8_t *)0x149817;
    defyx::JitCompilerX86::JitCompilerX86
              ((JitCompilerX86 *)(unaff_R12->programs[0].programBuffer + 0x80));
    puVar6 = &defyx::CompiledLightVm<defyx::LargePageAllocator,true>::vtable;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    cRam000000000025ee80 = (cRam000000000025ee80 + -0x40) - (0xffffffffffed08bf < uVar8);
    switchD_0011c339::switchdataD_0012f740._0_1_ = 0x3b;
    unaff_R12->memory = (uint8_t *)&PTR__CompiledVm_00136bf8;
    defyx::JitCompilerX86::JitCompilerX86
              ((JitCompilerX86 *)(unaff_R12->programs[0].programBuffer + 0x80));
    goto LAB_0011cd72;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    unaff_R12->memory = (uint8_t *)0x149b62;
    defyx::JitCompilerX86::JitCompilerX86
              ((JitCompilerX86 *)(unaff_R12->programs[0].programBuffer + 0x80));
    puVar6 = &defyx::CompiledLightVm<defyx::LargePageAllocator,false>::vtable;
    puVar9 = &stack0xffffffffffffffd8;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    pcVar1 = (char *)((long)lutDec3 + uVar8 + 0x389);
    *pcVar1 = *pcVar1 + cVar7;
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar7;
    pcVar1 = (char *)((long)lutDec3 + uVar8 + 0x3c6);
    *pcVar1 = *pcVar1 + '@';
    switchD_0011c339::switchdataD_0012f740._0_1_ = 0x3b;
    puVar6 = &defyx::InterpretedLightVm<defyx::LargePageAllocator,true>::vtable;
    puVar9 = (undefined1 *)0x41024;
  }
  unaff_R12->memory = puVar6 + 0x10;
  puVar10 = puVar9;
LAB_0011cd72:
  if ((ulong)dVar11 != 0) {
    pcVar2 = *(code **)(unaff_R12->memory + 0x28);
    *(undefined8 *)(puVar10 + -8) = 0x11cd86;
    (*pcVar2)();
    *(undefined8 *)(puVar10 + -8) = 0x11cd9c;
    std::__cxx11::string::_M_assign((string *)(unaff_R12->programs[0].programBuffer + 0x7c));
  }
  if (pdVar3 != (defyx_cache *)0x0) {
    pcVar2 = *(code **)(unaff_R12->memory + 0x20);
    *(undefined8 *)(puVar10 + -8) = 0x11cdad;
    (*pcVar2)();
  }
  pcVar2 = *(code **)(unaff_R12->memory + 0x10);
  *(undefined8 *)(puVar10 + -8) = 0x11cdb6;
  (*pcVar2)();
  return unaff_R12;
}

Assistant:

defyx_cache *defyx_alloc_cache(defyx_flags flags) {
		defyx_cache *cache;

		try {
			cache = new defyx_cache();
			switch (flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES)) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				defyx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}